

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O3

void __thiscall arangodb::velocypack::Builder::clear(Builder *this)

{
  pointer pCVar1;
  pointer puVar2;
  Buffer<unsigned_char> *pBVar3;
  
  this->_pos = 0;
  pCVar1 = (this->_stack).
           super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_stack).
      super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar1) {
    (this->_stack).
    super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar1;
  }
  puVar2 = (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  pBVar3 = this->_bufferPtr;
  if (pBVar3 != (Buffer<unsigned_char> *)0x0) {
    pBVar3->_size = 0;
    *pBVar3->_buffer = '\0';
    this->_start = this->_bufferPtr->_buffer;
  }
  this->_keyWritten = false;
  return;
}

Assistant:

void clear() noexcept {
    _pos = 0;
    _stack.clear();
    _indexes.clear();
    if (_bufferPtr != nullptr) {
      _bufferPtr->reset();
      _start = _bufferPtr->data();
    }
    _keyWritten = false;
  }